

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodetplus_pnnx.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pOVar1;
  undefined8 *puVar2;
  Allocator **ppAVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined4 uVar10;
  ulong uVar7;
  undefined4 uVar11;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int *piVar15;
  bool bVar16;
  undefined1 *puVar17;
  char cVar18;
  int iVar19;
  float *pfVar20;
  size_t sVar21;
  vector<Object,_std::allocator<Object>_> *pvVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  pointer pOVar26;
  uint uVar27;
  int left;
  float fVar28;
  float fVar29;
  int top;
  float fVar31;
  __m128 t_2;
  undefined1 auVar30 [16];
  int iVar32;
  int w;
  int iVar34;
  undefined8 uVar33;
  __m128 t;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int baseLine;
  vector<Object,_std::allocator<Object>_> objects8;
  vector<Object,_std::allocator<Object>_> proposals;
  Extractor ex;
  vector<float,_std::allocator<float>_> areas;
  vector<Object,_std::allocator<Object>_> objects;
  float mean_vals [3];
  undefined1 local_288 [64];
  size_t local_248;
  undefined8 local_238;
  int iStack_230;
  int iStack_22c;
  float norm_vals [3];
  Mat image;
  float local_200;
  float fStack_1fc;
  Allocator *local_1e8;
  Net nanodet;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar12 = argv[1];
    std::__cxx11::string::string((string *)&nanodet,pcVar12,(allocator *)&image);
    cv::imread((string *)&m,(int)&nanodet);
    if ((Allocator **)nanodet._vptr_Net != &nanodet.opt.blob_allocator) {
      operator_delete(nanodet._vptr_Net);
    }
    cVar18 = cv::Mat::empty();
    if (cVar18 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&nanodet);
      nanodet.opt.use_vulkan_compute = true;
      iVar19 = ncnn::Net::load_param(&nanodet,"nanodet-plus-m_416.torchscript.ncnn.param");
      if ((iVar19 != 0) ||
         (iVar19 = ncnn::Net::load_model(&nanodet,"nanodet-plus-m_416.torchscript.ncnn.bin"),
         iVar19 != 0)) {
        exit(-1);
      }
      iVar19 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      if (iVar19 < w) {
        fVar35 = 416.0 / (float)w;
        local_238._4_4_ = (int)((float)iVar19 * fVar35);
        local_238._0_4_ = 0x1a0;
      }
      else {
        fVar35 = 416.0 / (float)iVar19;
        local_238._0_4_ = (int)((float)w * fVar35);
        local_238._4_4_ = 0x1a0;
      }
      iStack_230 = 0;
      iStack_22c = 0;
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_80,2,w,iVar19,(int)local_238,local_238._4_4_,(Allocator *)0x0);
      local_248 = 0;
      local_288._0_4_ = 0;
      local_288._4_4_ = 0;
      local_288._8_4_ = 0;
      local_288._12_4_ = 0;
      local_288._16_4_ = 0;
      local_288._20_4_ = 0;
      local_288._24_4_ = 0;
      local_288._32_8_ = (Allocator *)0x0;
      local_288._40_4_ = 0;
      local_288._44_4_ = 0;
      local_288._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&areas);
      iVar32 = (((int)local_238 + 0x1f) / 0x20) * 0x20 - (int)local_238;
      iVar34 = ((local_238._4_4_ + 0x1f) / 0x20) * 0x20 - local_238._4_4_;
      left = iVar32 / 2;
      top = iVar34 / 2;
      iStack_230 = -iStack_230 / 2;
      iStack_22c = -iStack_22c / 2;
      local_238 = CONCAT44(top,left);
      ncnn::copy_make_border
                ((Mat *)&image,(Mat *)local_288,top,iVar34 - top,left,iVar32 - left,0,0.0,
                 (Option *)&areas);
      mean_vals[0] = 103.53;
      mean_vals[1] = 116.28;
      mean_vals[2] = 123.675;
      norm_vals[0] = 0.017429;
      norm_vals[1] = 0.017507;
      norm_vals[2] = 0.017125;
      ncnn::Mat::substract_mean_normalize((Mat *)local_288,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"in0",(Mat *)local_288);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar22 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"231",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,8,(Mat *)&objects8,0.0,pvVar22);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar22 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"228",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x10,(Mat *)&objects8,0.0,pvVar22);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar22 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"225",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x20,(Mat *)&objects8,0.0,pvVar22);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar22 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"222",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x40,(Mat *)&objects8,0.0,pvVar22);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      pOVar26 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)((ulong)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1);
        pOVar26 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      uVar27 = (int)((long)pOVar26 -
                     (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x55555555;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)(int)uVar27,(allocator_type *)&baseLine);
      if (0 < (int)uVar27) {
        pfVar20 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar25 = 0;
        do {
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar25] = pfVar20[-1] * *pfVar20;
          uVar25 = uVar25 + 1;
          pfVar20 = pfVar20 + 6;
        } while ((uVar27 & 0x7fffffff) != uVar25);
        baseLine = 0;
        do {
          uVar24 = (uint)((ulong)((long)objects8.super__Vector_base<Object,_std::allocator<Object>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)objects8.super__Vector_base<Object,_std::allocator<Object>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
          if ((int)uVar24 < 1) {
LAB_00160a80:
            if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&objects8,
                         (iterator)
                         objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                         super__Vector_impl_data._M_finish,&baseLine);
            }
            else {
              ((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish)->rect).x = (float)baseLine;
              objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)&((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_finish)->rect).y;
            }
          }
          else {
            pOVar26 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + baseLine;
            bVar16 = true;
            uVar25 = 0;
            do {
              fVar36 = (&((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start)->rect).x)[uVar25];
              if (pOVar26->label ==
                  proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)fVar36].label) {
                pOVar1 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                         super__Vector_impl_data._M_start + (int)fVar36;
                uVar6._0_4_ = (pOVar26->rect).x;
                uVar6._4_4_ = (pOVar26->rect).y;
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar6;
                uVar4 = (pOVar26->rect).width;
                uVar10 = (pOVar26->rect).height;
                uVar7._0_4_ = (pOVar1->rect).x;
                uVar7._4_4_ = (pOVar1->rect).y;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar7;
                uVar5 = (pOVar1->rect).width;
                uVar11 = (pOVar1->rect).height;
                auVar30._0_4_ = (float)uVar5 + (float)(undefined4)uVar7;
                auVar30._4_4_ = (float)uVar11 + (float)uVar7._4_4_;
                auVar30._8_8_ = 0;
                auVar40 = maxps(auVar39,auVar40);
                auVar37._0_4_ = (float)uVar4 + (float)(undefined4)uVar6;
                auVar37._4_4_ = (float)uVar10 + (float)uVar6._4_4_;
                auVar37._8_8_ = 0;
                auVar30 = minps(auVar30,auVar37);
                fVar28 = auVar30._0_4_ - auVar40._0_4_;
                fVar31 = auVar30._4_4_ - auVar40._4_4_;
                fVar29 = 0.0;
                if (0.0 < fVar31 && 0.0 < fVar28) {
                  fVar29 = fVar28 * fVar31;
                }
                if (0.5 < fVar29 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                     .super__Vector_impl_data._M_start[baseLine] +
                                    areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[(int)fVar36]) - fVar29)) {
                  bVar16 = false;
                }
              }
              uVar25 = uVar25 + 1;
            } while ((uVar24 & 0x7fffffff) != uVar25);
            if (bVar16) goto LAB_00160a80;
          }
          baseLine = baseLine + 1;
        } while (baseLine < (int)uVar27);
      }
      if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar27 = (uint)((ulong)((long)objects8.super__Vector_base<Object,_std::allocator<Object>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)objects8.super__Vector_base<Object,_std::allocator<Object>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)(int)uVar27);
      if (0 < (int)uVar27) {
        uVar33 = CONCAT44((float)(iVar19 + -1),(float)(w + -1));
        lVar23 = 0;
        uVar25 = 0;
        do {
          fVar36 = (&((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start)->rect).x)[uVar25];
          uVar8 = *(undefined8 *)
                   &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)fVar36].rect.width;
          puVar2 = (undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar23);
          *puVar2 = *(undefined8 *)
                     &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)fVar36].rect;
          puVar2[1] = uVar8;
          *(undefined8 *)
           ((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start)->label + lVar23) =
               *(undefined8 *)
                &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)fVar36].label;
          uVar8 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar23);
          uVar9 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).width + lVar23);
          fVar36 = (float)uVar8;
          fVar28 = (float)((ulong)uVar8 >> 0x20);
          auVar38._0_4_ = fVar36 - (float)(int)local_238;
          auVar38._4_4_ = fVar28 - (float)local_238._4_4_;
          auVar38._8_4_ = 0.0 - (float)iStack_230;
          auVar38._12_4_ = 0.0 - (float)iStack_22c;
          auVar13._4_4_ = fVar35;
          auVar13._0_4_ = fVar35;
          auVar13._8_4_ = fVar35;
          auVar13._12_4_ = fVar35;
          auVar30 = divps(auVar38,auVar13);
          auVar41._0_4_ = ((float)uVar9 + fVar36) - (float)(int)local_238;
          auVar41._4_4_ = ((float)((ulong)uVar9 >> 0x20) + fVar28) - (float)local_238._4_4_;
          auVar41._8_4_ = 0.0 - (float)iStack_230;
          auVar41._12_4_ = 0.0 - (float)iStack_22c;
          auVar14._4_4_ = fVar35;
          auVar14._0_4_ = fVar35;
          auVar14._8_4_ = fVar35;
          auVar14._12_4_ = fVar35;
          auVar40 = divps(auVar41,auVar14);
          auVar42._8_4_ = 0xbf800000;
          auVar42._0_8_ = uVar33;
          auVar42._12_4_ = 0xbf800000;
          auVar30 = minps(auVar42,auVar30);
          auVar30 = maxps(ZEXT816(0),auVar30);
          auVar43._8_4_ = 0xbf800000;
          auVar43._0_8_ = uVar33;
          auVar43._12_4_ = 0xbf800000;
          auVar40 = minps(auVar43,auVar40);
          auVar40 = maxps(ZEXT816(0),auVar40);
          *(long *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar23) = auVar30._0_8_;
          *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).width + lVar23) =
               CONCAT44(auVar40._4_4_ - auVar30._4_4_,auVar40._0_4_ - auVar30._0_4_);
          uVar25 = uVar25 + 1;
          lVar23 = lVar23 + 0x18;
        } while ((uVar27 & 0x7fffffff) != uVar25);
      }
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar15 = (int *)CONCAT44(local_288._12_4_,local_288._8_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if ((Allocator *)local_288._32_8_ == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_288._4_4_,local_288._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_288._4_4_,local_288._0_4_));
            }
          }
          else {
            (*(*(_func_int ***)local_288._32_8_)[3])();
          }
        }
      }
      piVar15 = (int *)CONCAT44(fStack_1fc,local_200);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_1e8 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_1e8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&nanodet);
      cv::Mat::clone();
      puVar17 = (undefined1 *)CONCAT44(local_288._4_4_,local_288._0_4_);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar23 = 0;
        uVar25 = 0;
        pOVar26 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_238 = uVar25;
          local_288._0_8_ = puVar17;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&pOVar26->prob + lVar23),
                  (double)*(float *)((long)&(pOVar26->rect).x + lVar23),
                  (double)*(float *)((long)&(pOVar26->rect).y + lVar23),
                  (double)*(float *)((long)&(pOVar26->rect).width + lVar23),
                  (double)*(float *)((long)&(pOVar26->rect).height + lVar23),
                  (ulong)*(uint *)((long)&pOVar26->label + lVar23));
          local_288._16_4_ = 0;
          local_288._20_4_ = 0;
          local_288._0_4_ = 0x3010000;
          pfVar20 = (float *)((long)&(pOVar26->rect).x + lVar23);
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = (int)ROUND(pfVar20[1]);
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = (int)ROUND(*pfVar20);
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = (int)ROUND(pfVar20[2]);
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ = (int)ROUND(pfVar20[3]);
          nanodet._vptr_Net = (_func_int **)0x406fe00000000000;
          nanodet.opt.workspace_allocator = (Allocator *)0x0;
          nanodet.opt.lightmode = false;
          nanodet.opt._1_3_ = 0;
          nanodet.opt.num_threads = 0;
          nanodet.opt.blob_allocator = (Allocator *)0x0;
          local_288._8_8_ = &image;
          cv::rectangle((string *)local_288,&objects8,&nanodet,1,8,0);
          sprintf((char *)&nanodet,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar26->prob + lVar23) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar26->label + lVar23) * 4));
          baseLine = 0;
          local_288._0_8_ = local_288 + 0x10;
          sVar21 = strlen((char *)&nanodet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,&nanodet,(long)&nanodet._vptr_Net + sVar21);
          cv::getTextSize((string *)mean_vals,(int)(string *)local_288,0.5,0,(int *)0x1);
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_);
          }
          fVar35 = (float)(int)*(float *)((long)&(pOVar26->rect).x + lVar23);
          iVar19 = (int)((*(float *)((long)&(pOVar26->rect).y + lVar23) - (float)(int)mean_vals[1])
                        - (float)baseLine);
          if (iVar19 < 1) {
            iVar19 = 0;
          }
          fVar36 = (float)((int)fStack_1fc - (int)mean_vals[0]);
          if ((int)mean_vals[0] + (int)fVar35 <= (int)fStack_1fc) {
            fVar36 = fVar35;
          }
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x3010000;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&image;
          ex.d._4_4_ = baseLine + (int)mean_vals[1];
          ex.d._0_4_ = mean_vals[0];
          local_288._0_4_ = 0;
          local_288._4_4_ = 0x406fe000;
          local_288._8_4_ = 0;
          local_288._12_4_ = 0x406fe000;
          local_288._16_4_ = 0;
          local_288._20_4_ = 0x406fe000;
          local_288._24_4_ = 0;
          local_288._28_4_ = 0;
          ex._vptr_Extractor._0_4_ = fVar36;
          ex._vptr_Extractor._4_4_ = iVar19;
          cv::rectangle(&proposals,&ex,(string *)local_288,0xffffffff,8,0);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x3010000;
          local_288._0_8_ = local_288 + 0x10;
          sVar21 = strlen((char *)&nanodet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_288,&nanodet,(long)&nanodet._vptr_Net + sVar21);
          norm_vals[1] = (float)(iVar19 + (int)mean_vals[1]);
          norm_vals[0] = fVar36;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          cv::putText(0x3fe0000000000000,&proposals,(string *)local_288,norm_vals,0,&areas,1,8,0);
          uVar25 = local_238;
          puVar17 = (undefined1 *)local_288._0_8_;
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_);
            puVar17 = (undefined1 *)local_288._0_8_;
          }
          local_288._4_4_ = (undefined4)((ulong)puVar17 >> 0x20);
          uVar25 = uVar25 + 1;
          lVar23 = lVar23 + 0x18;
          pOVar26 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar25 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_288._8_8_ = &image;
      ppAVar3 = &nanodet.opt.blob_allocator;
      nanodet.opt.blob_allocator =
           (Allocator *)CONCAT26(nanodet.opt.blob_allocator._6_2_,0x6567616d69);
      nanodet.opt.lightmode = true;
      nanodet.opt._1_3_ = 0;
      nanodet.opt.num_threads = 0;
      local_288._16_4_ = 0;
      local_288._20_4_ = 0;
      local_288._0_4_ = 0x1010000;
      nanodet._vptr_Net = (_func_int **)ppAVar3;
      cv::imshow((string *)&nanodet,(_InputArray *)local_288);
      if ((Allocator **)nanodet._vptr_Net != ppAVar3) {
        operator_delete(nanodet._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar19 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar12);
      iVar19 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar19 = -1;
  }
  return iVar19;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_nanodet(m, objects);

    draw_objects(m, objects);

    return 0;
}